

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
::emplace_new_key<slang::SVInt&>
          (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SVInt *key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar7;
  bool local_7d [13];
  templated_iterator<slang::SVInt> local_70;
  iterator result;
  value_type to_insert;
  templated_iterator<slang::SVInt> local_50 [3];
  SVInt *local_38;
  SVInt *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  *this_local;
  bool local_10;
  
  local_38 = key;
  key_local = (SVInt *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 0x10) != 0) &&
     ((sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
       )distance_from_desired != this[0x19])) {
    lVar3 = *(long *)(this + 0x20) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 0x10) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x1c)) {
      bVar1 = sherwood_v3_entry<slang::SVInt>::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<slang::SVInt>::emplace<slang::SVInt&>
                  ((sherwood_v3_entry<slang::SVInt> *)key_local,(int8_t)current_entry_local._7_1_,
                   local_38);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
        ::templated_iterator<slang::SVInt>::templated_iterator(local_50,(EntryPointer)key_local);
        to_insert.super_SVIntStorage._15_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
                            *)&this_local,local_50,(bool *)&to_insert.super_SVIntStorage.field_0xf);
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        slang::SVInt::SVInt((SVInt *)&result,local_38);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::SVInt>((SVInt *)&result,(SVInt *)&(key_local->super_SVIntStorage).bitWidth)
        ;
        sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
        ::templated_iterator<slang::SVInt>::templated_iterator(&local_70,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = (SVInt *)&key_local[1].super_SVIntStorage.bitWidth;
            bVar1 = sherwood_v3_entry<slang::SVInt>::is_empty
                              ((sherwood_v3_entry<slang::SVInt> *)key_local);
            if (bVar1) {
              sherwood_v3_entry<slang::SVInt>::emplace<slang::SVInt>
                        ((sherwood_v3_entry<slang::SVInt> *)key_local,
                         (int8_t)current_entry_local._7_1_,(SVInt *)&result);
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              local_7d[0] = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
                          *)&this_local,&local_70,local_7d);
              goto LAB_002b6ec5;
            }
            if ((char)current_entry_local._7_1_ <= *(char *)&(key_local->super_SVIntStorage).field_0
               ) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::SVInt>
                      ((SVInt *)&result,(SVInt *)&(key_local->super_SVIntStorage).bitWidth);
            current_entry_local._7_1_ =
                 (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x19]);
        std::swap<slang::SVInt>((SVInt *)&result,&((local_70.current)->field_1).value);
        sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
        ::grow((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                *)this);
        pVar6 = sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                ::emplace<slang::SVInt>
                          ((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                            *)this,(SVInt *)&result);
        this_local = (sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                      *)pVar6.first.current;
        local_10 = pVar6.second;
LAB_002b6ec5:
        slang::SVInt::~SVInt((SVInt *)&result);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_002b6ece;
    }
  }
  sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  ::grow((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          *)this);
  pVar6 = emplace<slang::SVInt&>(this,local_38);
  local_10 = pVar6.second;
LAB_002b6ece:
  this_local = (sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }